

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::DefaultPrintTo<std::vector<unsigned_char,std::allocator<unsigned_char>>>
               (long *param_1,ostream *param_2)

{
  long lVar1;
  long lVar2;
  
  std::operator<<(param_2,'{');
  lVar1 = *param_1;
  lVar2 = 0;
  do {
    if ((uchar *)(lVar1 + lVar2) == (uchar *)param_1[1]) {
      if (lVar2 != 0) {
LAB_001d85ab:
        std::operator<<(param_2,' ');
      }
      std::operator<<(param_2,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(param_2,','), lVar2 == 0x20)) {
      std::operator<<(param_2," ...");
      goto LAB_001d85ab;
    }
    std::operator<<(param_2,' ');
    UniversalPrinter<unsigned_char>::Print((uchar *)(lVar1 + lVar2),param_2);
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void DefaultPrintTo(WrapPrinterType<kPrintContainer> /* dummy */,
                    const C& container, ::std::ostream* os) {
  const size_t kMaxCount = 32;  // The maximum number of elements to print.
  *os << '{';
  size_t count = 0;
  for (typename C::const_iterator it = container.begin();
       it != container.end(); ++it, ++count) {
    if (count > 0) {
      *os << ',';
      if (count == kMaxCount) {  // Enough has been printed.
        *os << " ...";
        break;
      }
    }
    *os << ' ';
    // We cannot call PrintTo(*it, os) here as PrintTo() doesn't
    // handle *it being a native array.
    internal::UniversalPrint(*it, os);
  }

  if (count > 0) {
    *os << ' ';
  }
  *os << '}';
}